

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

void vttbr_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  uint64_t uVar1;
  CPUARMState_conflict *__mptr;
  
  uVar1 = raw_read(env,ri);
  if (uVar1 == value) {
    return;
  }
  tlb_flush_by_mmuidx_aarch64((CPUState *)(env[-4].vfp.zregs[0x17].d + 0x14),0x80d);
  raw_write(env,ri,value);
  return;
}

Assistant:

static void vttbr_write(CPUARMState *env, const ARMCPRegInfo *ri,
                        uint64_t value)
{
    ARMCPU *cpu = env_archcpu(env);
    CPUState *cs = CPU(cpu);

    /*
     * A change in VMID to the stage2 page table (Stage2) invalidates
     * the combined stage 1&2 tlbs (EL10_1 and EL10_0).
     */
    if (raw_read(env, ri) != value) {
        tlb_flush_by_mmuidx(cs,
                            ARMMMUIdxBit_E10_1 |
                            ARMMMUIdxBit_E10_1_PAN |
                            ARMMMUIdxBit_E10_0 |
                            ARMMMUIdxBit_Stage2);
        raw_write(env, ri, value);
    }
}